

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

int64_t __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::ConnectIndex
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int con)

{
  ostream *poVar1;
  
  if (5 < (uint)con) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "TPZCompElHDiv::ConnectIndex wrong parameter connect ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,con);
    poVar1 = std::operator<<(poVar1," NConnects ");
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzelchdiv.cpp"
               ,0x156);
  }
  return (this->fConnectIndexes).super_TPZVec<long>.fStore[(uint)con];
}

Assistant:

int64_t TPZCompElHDiv<TSHAPE>::ConnectIndex(int con) const{
#ifndef PZNODEBUG
	if(con<0 || con > TSHAPE::NFacets) {
		std::cout << "TPZCompElHDiv::ConnectIndex wrong parameter connect " << con <<
		" NConnects " << TSHAPE::NFacets << std::endl;
		DebugStop();
		return -1;
	}

#endif

	return this->fConnectIndexes[con];
}